

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

int64_t helper_fistll_ST0_x86_64(CPUX86State *env)

{
  int iVar1;
  uint uVar2;
  floatx80 a;
  int64_t iStack_18;
  char old_exp_flags;
  int64_t val;
  CPUX86State *env_local;
  
  iVar1 = get_float_exception_flags(&env->fp_status);
  set_float_exception_flags(0,&env->fp_status);
  a._10_6_ = 0;
  a._0_10_ = *(unkuint10 *)(env->fpregs + env->fpstt);
  iStack_18 = floatx80_to_int64_x86_64(a,&env->fp_status);
  uVar2 = get_float_exception_flags(&env->fp_status);
  if ((uVar2 & 1) != 0) {
    iStack_18 = -0x8000000000000000;
  }
  uVar2 = get_float_exception_flags(&env->fp_status);
  set_float_exception_flags(uVar2 | (int)(char)iVar1,&env->fp_status);
  return iStack_18;
}

Assistant:

int64_t helper_fistll_ST0(CPUX86State *env)
{
    int64_t val;
    signed char old_exp_flags;

    old_exp_flags = get_float_exception_flags(&env->fp_status);
    set_float_exception_flags(0, &env->fp_status);

    val = floatx80_to_int64(ST0, &env->fp_status);
    if (get_float_exception_flags(&env->fp_status) & float_flag_invalid) {
        val = 0x8000000000000000ULL;
    }
    set_float_exception_flags(get_float_exception_flags(&env->fp_status)
                                | old_exp_flags, &env->fp_status);
    return val;
}